

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifgtw_cb(void *ctx0,vocdef *voc,vocwdef *vocw)

{
  long lVar1;
  uint16_t tmp;
  bifgtw_cb_ctx *ctx;
  
  if (((vocw->vocwflg & 8) == 0) && (*(uint *)((long)ctx0 + 8) == (uint)vocw->vocwtyp)) {
    **ctx0 = 3;
    memcpy((void *)(*ctx0 + 3),voc->voctxt,(ulong)voc->voclen);
    if (voc->vocln2 == '\0') {
      *(ushort *)(*ctx0 + 1) = voc->voclen + 2;
      lVar1 = (ulong)voc->voclen + *ctx0 + 3;
    }
    else {
      *(undefined1 *)(*ctx0 + 3 + (ulong)voc->voclen) = 0x20;
      memcpy((void *)(*ctx0 + (ulong)voc->voclen + 4),voc->voctxt + voc->voclen,(ulong)voc->vocln2);
      *(ushort *)(*ctx0 + 1) = (ushort)voc->voclen + (ushort)voc->vocln2 + 3;
      lVar1 = (ulong)voc->voclen + *ctx0 + (ulong)voc->vocln2 + 4;
    }
    *(long *)ctx0 = lVar1;
  }
  return;
}

Assistant:

static void bifgtw_cb(void *ctx0, vocdef *voc, vocwdef *vocw)
{
    struct bifgtw_cb_ctx *ctx = (struct bifgtw_cb_ctx *)ctx0;

    /* ignore deleted objects */
    if (vocw->vocwflg & VOCFDEL)
        return;

    /* ignore objects of the inappropriate type */
    if (vocw->vocwtyp != ctx->typ)
        return;
    
    /* the datatype is string */
    *ctx->p = DAT_SSTRING;

    /* copy the first word */
    memcpy(ctx->p + 3, voc->voctxt, (size_t)voc->voclen);

    /* if there are two words, add a space and the second word */
    if (voc->vocln2)
    {
        *(ctx->p + 3 + voc->voclen) = ' ';
        memcpy(ctx->p + 4 + voc->voclen, voc->voctxt + voc->voclen,
               (size_t)voc->vocln2);
        oswp2(ctx->p + 1, voc->voclen + voc->vocln2 + 3);
        ctx->p += voc->voclen + voc->vocln2 + 4;
    }
    else
    {
        oswp2(ctx->p + 1, voc->voclen+2);
        ctx->p += voc->voclen + 3;
    }
}